

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directed_Energy_Fire_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Directed_Energy_Fire_PDU::ClearDirectedEnergyRecords(Directed_Energy_Fire_PDU *this)

{
  pointer pKVar1;
  pointer pKVar2;
  pointer pKVar3;
  
  pKVar1 = (this->m_vDeRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vDeRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pKVar3 = pKVar1;
  if (pKVar2 != pKVar1) {
    do {
      (**pKVar3->_vptr_KRef_Ptr)(pKVar3);
      pKVar3 = pKVar3 + 1;
    } while (pKVar3 != pKVar2);
    (this->m_vDeRec).
    super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar1;
  }
  this->m_ui16NumDERecs = 0;
  (this->super_Header).super_Header6.m_ui16PDULength = 0x58;
  return;
}

Assistant:

void Directed_Energy_Fire_PDU::ClearDirectedEnergyRecords()
{
    m_vDeRec.clear();
    m_ui16NumDERecs = 0;
    m_ui16PDULength = DIRECTED_ENERGY_PDU_SIZE;
}